

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c352.c
# Opt level: O0

UINT8 device_start_c352(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DATA devData;
  short local_2e;
  int local_2c;
  INT16 j;
  int i;
  C352 *c;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  devData.chipInf = calloc(1,0x6a8);
  if ((DEV_DATA *)devData.chipInf == (DEV_DATA *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    ((DEV_DATA *)((long)devData.chipInf + 0x490))->chipInf = (void *)0x0;
    *(undefined4 *)&((DEV_DATA *)((long)devData.chipInf + 0x498))->chipInf = 0;
    *(uint *)&((DEV_DATA *)((long)devData.chipInf + 8))->chipInf = cfg->clock / 0x120;
    *(UINT8 *)&((DEV_DATA *)((long)devData.chipInf + 0x4a0))->chipInf = cfg->flags;
    c352_set_mute_mask(devData.chipInf,0);
    local_2e = 0;
    for (local_2c = 0; local_2c < 0x80; local_2c = local_2c + 1) {
      *(short *)((long)devData.chipInf + (long)local_2c * 2 + 0x4a2) = local_2e << 5;
      if (local_2c < 0x10) {
        local_2e = local_2e + 1;
      }
      else if (local_2c < 0x18) {
        local_2e = local_2e + 2;
      }
      else if (local_2c < 0x30) {
        local_2e = local_2e + 4;
      }
      else if (local_2c < 100) {
        local_2e = local_2e + 8;
      }
      else {
        local_2e = local_2e + 0x10;
      }
    }
    for (local_2c = 0x80; local_2c < 0x100; local_2c = local_2c + 1) {
      *(ushort *)((long)devData.chipInf + (long)local_2c * 2 + 0x4a2) =
           (*(ushort *)((long)devData.chipInf + (long)(local_2c + -0x80) * 2 + 0x4a2) ^ 0xffff) &
           0xffe0;
    }
    *(void **)devData.chipInf = devData.chipInf;
    INIT_DEVINF(retDevInf,(DEV_DATA *)devData.chipInf,*(UINT32 *)((long)devData.chipInf + 8),&devDef
               );
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_c352(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	C352 *c;
	int i;
	INT16 j;

	c = (C352 *)calloc(1, sizeof(C352));
	if (c == NULL)
		return 0xFF;

	c->wave = NULL;
	c->wavesize = 0x00;

	//c->sample_rate_base = cfg->clock / 576;	// sample rate according to superctr
	c->sample_rate_base = cfg->clock / 288;	// TODO: output at 43 KHz and fix sample reading/interpolation code
	c->muteRear = cfg->flags;

	//device_reset_c352(c);

	c352_set_mute_mask(c, 0x00000000);
	
	j=0;
	for(i=0;i<128;i++)
	{
		c->mulaw_table[i] = j<<5;
		if(i < 16)
			j += 1;
		else if(i < 24)
			j += 2;
		else if(i < 48)
			j += 4;
		else if(i < 100)
			j += 8;
		else
			j += 16;
	}
	for(i=128;i<256;i++)
		c->mulaw_table[i] = (~c->mulaw_table[i-128])&~0x1f;

	c->_devData.chipInf = c;
	INIT_DEVINF(retDevInf, &c->_devData, c->sample_rate_base, &devDef);
	return 0x00;
}